

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

cs_err cs_open(cs_arch arch,cs_mode mode,csh *handle)

{
  cs_err cVar1;
  cs_struct *pcVar2;
  undefined4 in_ECX;
  int iVar3;
  cs_err cVar4;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(cs_mem_malloc == (cs_malloc_t)0x0);
  auVar5._4_4_ = -(uint)(cs_mem_calloc == (cs_calloc_t)0x0);
  auVar5._8_4_ = -(uint)(cs_mem_realloc == (cs_realloc_t)0x0);
  auVar5._12_4_ = -(uint)(cs_mem_free == (cs_free_t)0x0);
  iVar3 = movmskps(in_ECX,auVar5);
  if (iVar3 != 0) {
    return CS_ERR_MEMSETUP;
  }
  if (cs_vsnprintf == (cs_vsnprintf_t)0x0) {
    return CS_ERR_MEMSETUP;
  }
  if (arch < CS_ARCH_MAX) {
    if ((cs_arch_disallowed_mode_mask[arch] & mode) == CS_MODE_ARM) {
      pcVar2 = (cs_struct *)(*cs_mem_calloc)(1,0xb8);
      if (pcVar2 == (cs_struct *)0x0) {
        return CS_ERR_MEM;
      }
      pcVar2->errnum = CS_ERR_OK;
      pcVar2->arch = arch;
      pcVar2->mode = mode;
      pcVar2->detail = CS_OPT_OFF;
      (pcVar2->skipdata_setup).mnemonic = ".byte";
      cVar1 = (*cs_arch_init[arch])(pcVar2);
      cVar4 = CS_ERR_OK;
      if (cVar1 != CS_ERR_OK) {
        (*cs_mem_free)(pcVar2);
        pcVar2 = (cs_struct *)0x0;
        cVar4 = cVar1;
      }
      goto LAB_001d5a94;
    }
    cVar4 = CS_ERR_MODE;
  }
  else {
    cVar4 = CS_ERR_ARCH;
  }
  pcVar2 = (cs_struct *)0x0;
LAB_001d5a94:
  *handle = (csh)pcVar2;
  return cVar4;
}

Assistant:

CAPSTONE_API cs_open(cs_arch arch, cs_mode mode, csh *handle)
{
	cs_err err;
	struct cs_struct *ud;
	if (!cs_mem_malloc || !cs_mem_calloc || !cs_mem_realloc || !cs_mem_free || !cs_vsnprintf)
		// Error: before cs_open(), dynamic memory management must be initialized
		// with cs_option(CS_OPT_MEM)
		return CS_ERR_MEMSETUP;

	if (arch < CS_ARCH_MAX && cs_arch_init[arch]) {
		// verify if requested mode is valid
		if (mode & cs_arch_disallowed_mode_mask[arch]) {
			*handle = 0;
			return CS_ERR_MODE;
		}

		ud = cs_mem_calloc(1, sizeof(*ud));
		if (!ud) {
			// memory insufficient
			return CS_ERR_MEM;
		}

		ud->errnum = CS_ERR_OK;
		ud->arch = arch;
		ud->mode = mode;
		// by default, do not break instruction into details
		ud->detail = CS_OPT_OFF;

		// default skipdata setup
		ud->skipdata_setup.mnemonic = SKIPDATA_MNEM;

		err = cs_arch_init[ud->arch](ud);
		if (err) {
			cs_mem_free(ud);
			*handle = 0;
			return err;
		}

		*handle = (uintptr_t)ud;

		return CS_ERR_OK;
	} else {
		*handle = 0;
		return CS_ERR_ARCH;
	}
}